

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

DILogger * __thiscall
glcts::anon_unknown_0::DIResult::sub_result
          (DILogger *__return_storage_ptr__,DIResult *this,long _code)

{
  DILogger *rhs;
  DILogger local_1a0;
  long local_20;
  long _code_local;
  DIResult *this_local;
  
  local_20 = _code;
  _code_local = (long)this;
  this_local = (DIResult *)__return_storage_ptr__;
  if (_code == 0) {
    sub_result_inner(&local_1a0,this,0);
    rhs = DILogger::nullify(&local_1a0);
    DILogger::DILogger(__return_storage_ptr__,rhs);
    DILogger::~DILogger(&local_1a0);
  }
  else {
    sub_result_inner(__return_storage_ptr__,this,_code);
  }
  return __return_storage_ptr__;
}

Assistant:

DILogger sub_result(long _code)
	{
		if (_code == NO_ERROR)
		{
			return sub_result_inner(_code).nullify();
		}
		else
		{
			return sub_result_inner(_code);
		}
	}